

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx2_adder_forest(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 (*pauVar4) [32];
  ulong uVar5;
  long lVar6;
  uint16_t *puVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  
  auVar38 = ZEXT1664((undefined1  [16])0x0);
  local_280 = vmovdqa64_avx512f(auVar38);
  local_2c0 = vmovdqa64_avx512f(auVar38);
  local_300 = vmovdqa64_avx512f(auVar38);
  local_340 = vmovdqa64_avx512f(auVar38);
  local_380 = vmovdqa64_avx512f(auVar38);
  local_3c0 = vmovdqa64_avx512f(auVar38);
  local_400 = vmovdqa64_avx512f(auVar38);
  local_440 = vmovdqa64_avx512f(auVar38);
  uVar3 = (ulong)(len >> 8);
  if (len < 0x100000) {
    uVar5 = 0;
  }
  else {
    puVar7 = array + 0xf0;
    uVar5 = 0;
    auVar12[8] = 0x55;
    auVar12._0_8_ = 0x5555555555555555;
    auVar12[9] = 0x55;
    auVar12[10] = 0x55;
    auVar12[0xb] = 0x55;
    auVar12[0xc] = 0x55;
    auVar12[0xd] = 0x55;
    auVar12[0xe] = 0x55;
    auVar12[0xf] = 0x55;
    auVar12[0x10] = 0x55;
    auVar12[0x11] = 0x55;
    auVar12[0x12] = 0x55;
    auVar12[0x13] = 0x55;
    auVar12[0x14] = 0x55;
    auVar12[0x15] = 0x55;
    auVar12[0x16] = 0x55;
    auVar12[0x17] = 0x55;
    auVar12[0x18] = 0x55;
    auVar12[0x19] = 0x55;
    auVar12[0x1a] = 0x55;
    auVar12[0x1b] = 0x55;
    auVar12[0x1c] = 0x55;
    auVar12[0x1d] = 0x55;
    auVar12[0x1e] = 0x55;
    auVar12[0x1f] = 0x55;
    auVar13[8] = 0x33;
    auVar13._0_8_ = 0x3333333333333333;
    auVar13[9] = 0x33;
    auVar13[10] = 0x33;
    auVar13[0xb] = 0x33;
    auVar13[0xc] = 0x33;
    auVar13[0xd] = 0x33;
    auVar13[0xe] = 0x33;
    auVar13[0xf] = 0x33;
    auVar13[0x10] = 0x33;
    auVar13[0x11] = 0x33;
    auVar13[0x12] = 0x33;
    auVar13[0x13] = 0x33;
    auVar13[0x14] = 0x33;
    auVar13[0x15] = 0x33;
    auVar13[0x16] = 0x33;
    auVar13[0x17] = 0x33;
    auVar13[0x18] = 0x33;
    auVar13[0x19] = 0x33;
    auVar13[0x1a] = 0x33;
    auVar13[0x1b] = 0x33;
    auVar13[0x1c] = 0x33;
    auVar13[0x1d] = 0x33;
    auVar13[0x1e] = 0x33;
    auVar13[0x1f] = 0x33;
    auVar14[8] = 7;
    auVar14._0_8_ = 0x707070707070707;
    auVar14[9] = 7;
    auVar14[10] = 7;
    auVar14[0xb] = 7;
    auVar14[0xc] = 7;
    auVar14[0xd] = 7;
    auVar14[0xe] = 7;
    auVar14[0xf] = 7;
    auVar14[0x10] = 7;
    auVar14[0x11] = 7;
    auVar14[0x12] = 7;
    auVar14[0x13] = 7;
    auVar14[0x14] = 7;
    auVar14[0x15] = 7;
    auVar14[0x16] = 7;
    auVar14[0x17] = 7;
    auVar14[0x18] = 7;
    auVar14[0x19] = 7;
    auVar14[0x1a] = 7;
    auVar14[0x1b] = 7;
    auVar14[0x1c] = 7;
    auVar14[0x1d] = 7;
    auVar14[0x1e] = 7;
    auVar14[0x1f] = 7;
    auVar9._8_2_ = 0xf;
    auVar9._0_8_ = 0xf000f000f000f;
    auVar9._10_2_ = 0xf;
    auVar9._12_2_ = 0xf;
    auVar9._14_2_ = 0xf;
    auVar9._16_2_ = 0xf;
    auVar9._18_2_ = 0xf;
    auVar9._20_2_ = 0xf;
    auVar9._22_2_ = 0xf;
    auVar9._24_2_ = 0xf;
    auVar9._26_2_ = 0xf;
    auVar9._28_2_ = 0xf;
    auVar9._30_2_ = 0xf;
    do {
      lVar6 = 0;
      do {
        local_4a0._8_8_ = local_280._40_8_;
        local_4a0._0_8_ = local_280._32_8_;
        local_4a0._16_8_ = local_280._48_8_;
        local_4a0._24_8_ = local_280._56_8_;
        auVar10 = *(undefined1 (*) [32])((long)puVar7 + lVar6 + -0x1e0);
        auVar11 = *(undefined1 (*) [32])((long)puVar7 + lVar6 + -0x1c0);
        auVar8 = *(undefined1 (*) [32])((long)puVar7 + lVar6 + -0x1a0);
        auVar19 = *(undefined1 (*) [32])((long)puVar7 + lVar6 + -0x180);
        auVar20 = *(undefined1 (*) [32])((long)puVar7 + lVar6 + -0x160);
        auVar39 = *(undefined1 (*) [32])((long)puVar7 + lVar6 + -0x140);
        auVar40 = *(undefined1 (*) [32])((long)puVar7 + lVar6 + -0x120);
        auVar41 = *(undefined1 (*) [32])((long)puVar7 + lVar6 + -0x100);
        auVar16 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar7 + lVar6 + -0xe0));
        auVar17 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar7 + lVar6 + -0xc0));
        auVar18 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar7 + lVar6 + -0xa0));
        auVar43 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar7 + lVar6 + -0x80));
        auVar33 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar7 + lVar6 + -0x60));
        auVar21 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar7 + lVar6 + -0x40));
        auVar22 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar7 + lVar6 + -0x20));
        auVar23 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar7 + lVar6));
        auVar42 = vpand_avx2(auVar10,auVar12);
        auVar15 = vpand_avx2(auVar11,auVar12);
        auVar24 = vpaddb_avx512vl(auVar15,auVar42);
        auVar42 = vpand_avx2(auVar8,auVar12);
        auVar15 = vpand_avx2(auVar19,auVar12);
        auVar25 = vpaddb_avx512vl(auVar15,auVar42);
        auVar42 = vpand_avx2(auVar20,auVar12);
        auVar15 = vpand_avx2(auVar39,auVar12);
        auVar26 = vpaddb_avx512vl(auVar15,auVar42);
        auVar42 = vpand_avx2(auVar40,auVar12);
        auVar15 = vpand_avx2(auVar41,auVar12);
        auVar27 = vpaddb_avx512vl(auVar15,auVar42);
        auVar42 = vpandq_avx512vl(auVar16,auVar12);
        auVar15 = vpandq_avx512vl(auVar17,auVar12);
        auVar28 = vpaddb_avx512vl(auVar15,auVar42);
        auVar42 = vpandq_avx512vl(auVar18,auVar12);
        auVar15 = vpandq_avx512vl(auVar43,auVar12);
        auVar29 = vpaddb_avx512vl(auVar15,auVar42);
        auVar42 = vpandq_avx512vl(auVar33,auVar12);
        auVar15 = vpandq_avx512vl(auVar21,auVar12);
        auVar30 = vpaddb_avx512vl(auVar15,auVar42);
        auVar42 = vpandq_avx512vl(auVar22,auVar12);
        auVar15 = vpandq_avx512vl(auVar23,auVar12);
        auVar31 = vpaddb_avx512vl(auVar15,auVar42);
        auVar10 = vpsrlw_avx2(auVar10,1);
        auVar11 = vpsrlw_avx2(auVar11,1);
        auVar10 = vpand_avx2(auVar10,auVar12);
        auVar11 = vpand_avx2(auVar11,auVar12);
        auVar10 = vpaddb_avx2(auVar11,auVar10);
        auVar11 = vpsrlw_avx2(auVar8,1);
        auVar8 = vpsrlw_avx2(auVar19,1);
        auVar11 = vpand_avx2(auVar11,auVar12);
        auVar8 = vpand_avx2(auVar8,auVar12);
        auVar11 = vpaddb_avx2(auVar8,auVar11);
        auVar8 = vpsrlw_avx2(auVar20,1);
        auVar19 = vpsrlw_avx2(auVar39,1);
        auVar8 = vpand_avx2(auVar8,auVar12);
        auVar19 = vpand_avx2(auVar19,auVar12);
        auVar8 = vpaddb_avx2(auVar19,auVar8);
        auVar19 = vpsrlw_avx2(auVar40,1);
        auVar20 = vpsrlw_avx2(auVar41,1);
        auVar19 = vpand_avx2(auVar19,auVar12);
        auVar20 = vpand_avx2(auVar20,auVar12);
        auVar19 = vpaddb_avx2(auVar20,auVar19);
        auVar20 = vpsrlw_avx512vl(auVar16,1);
        auVar39 = vpsrlw_avx512vl(auVar17,1);
        auVar20 = vpand_avx2(auVar20,auVar12);
        auVar39 = vpand_avx2(auVar39,auVar12);
        auVar32 = vpaddb_avx512vl(auVar39,auVar20);
        auVar20 = vpsrlw_avx512vl(auVar18,1);
        auVar39 = vpsrlw_avx512vl(auVar43,1);
        auVar20 = vpand_avx2(auVar20,auVar12);
        auVar39 = vpand_avx2(auVar39,auVar12);
        auVar18 = vpaddb_avx512vl(auVar39,auVar20);
        auVar20 = vpsrlw_avx512vl(auVar33,1);
        auVar39 = vpsrlw_avx512vl(auVar21,1);
        auVar20 = vpand_avx2(auVar20,auVar12);
        auVar39 = vpand_avx2(auVar39,auVar12);
        auVar43 = vpaddb_avx512vl(auVar39,auVar20);
        auVar20 = vpsrlw_avx512vl(auVar22,1);
        auVar39 = vpsrlw_avx512vl(auVar23,1);
        auVar20 = vpand_avx2(auVar20,auVar12);
        auVar39 = vpand_avx2(auVar39,auVar12);
        auVar33 = vpaddb_avx512vl(auVar39,auVar20);
        auVar20 = vpandq_avx512vl(auVar24,auVar13);
        auVar39 = vpandq_avx512vl(auVar25,auVar13);
        auVar21 = vpaddb_avx512vl(auVar39,auVar20);
        auVar20 = vpandq_avx512vl(auVar26,auVar13);
        auVar39 = vpandq_avx512vl(auVar27,auVar13);
        auVar22 = vpaddb_avx512vl(auVar39,auVar20);
        auVar20 = vpandq_avx512vl(auVar28,auVar13);
        auVar39 = vpandq_avx512vl(auVar29,auVar13);
        auVar23 = vpaddb_avx512vl(auVar39,auVar20);
        auVar20 = vpandq_avx512vl(auVar30,auVar13);
        auVar39 = vpandq_avx512vl(auVar31,auVar13);
        auVar20 = vpaddb_avx2(auVar39,auVar20);
        auVar39 = vpand_avx2(auVar10,auVar13);
        auVar40 = vpand_avx2(auVar11,auVar13);
        auVar39 = vpaddb_avx2(auVar40,auVar39);
        auVar40 = vpand_avx2(auVar8,auVar13);
        auVar41 = vpand_avx2(auVar19,auVar13);
        auVar40 = vpaddb_avx2(auVar41,auVar40);
        auVar41 = vpandq_avx512vl(auVar32,auVar13);
        auVar42 = vpandq_avx512vl(auVar18,auVar13);
        auVar41 = vpaddb_avx2(auVar42,auVar41);
        auVar42 = vpandq_avx512vl(auVar43,auVar13);
        auVar15 = vpandq_avx512vl(auVar33,auVar13);
        auVar42 = vpaddb_avx2(auVar15,auVar42);
        auVar15 = vpsrlw_avx512vl(auVar24,2);
        auVar16 = vpsrlw_avx512vl(auVar25,2);
        auVar15 = vpand_avx2(auVar15,auVar13);
        auVar16 = vpand_avx2(auVar16,auVar13);
        auVar15 = vpaddb_avx2(auVar16,auVar15);
        auVar16 = vpsrlw_avx512vl(auVar26,2);
        auVar17 = vpsrlw_avx512vl(auVar27,2);
        auVar16 = vpand_avx2(auVar16,auVar13);
        auVar17 = vpand_avx2(auVar17,auVar13);
        auVar16 = vpaddb_avx2(auVar17,auVar16);
        auVar17 = vpsrlw_avx512vl(auVar28,2);
        auVar24 = vpsrlw_avx512vl(auVar29,2);
        auVar17 = vpand_avx2(auVar17,auVar13);
        auVar24 = vpandq_avx512vl(auVar24,auVar13);
        auVar17 = vpaddb_avx512vl(auVar24,auVar17);
        auVar24 = vpsrlw_avx512vl(auVar30,2);
        auVar25 = vpsrlw_avx512vl(auVar31,2);
        auVar24 = vpandq_avx512vl(auVar24,auVar13);
        auVar25 = vpandq_avx512vl(auVar25,auVar13);
        auVar24 = vpaddb_avx512vl(auVar25,auVar24);
        auVar10 = vpsrlw_avx2(auVar10,2);
        auVar11 = vpsrlw_avx2(auVar11,2);
        auVar10 = vpand_avx2(auVar10,auVar13);
        auVar11 = vpand_avx2(auVar11,auVar13);
        auVar10 = vpaddb_avx2(auVar11,auVar10);
        auVar11 = vpsrlw_avx2(auVar8,2);
        auVar8 = vpsrlw_avx2(auVar19,2);
        auVar11 = vpand_avx2(auVar11,auVar13);
        auVar8 = vpand_avx2(auVar8,auVar13);
        auVar11 = vpaddb_avx2(auVar8,auVar11);
        auVar8 = vpsrlw_avx512vl(auVar32,2);
        auVar19 = vpsrlw_avx512vl(auVar18,2);
        auVar8 = vpand_avx2(auVar8,auVar13);
        auVar19 = vpand_avx2(auVar19,auVar13);
        auVar8 = vpaddb_avx2(auVar19,auVar8);
        auVar19 = vpsrlw_avx512vl(auVar43,2);
        auVar18 = vmovdqa64_avx512vl(local_380._0_32_);
        auVar43 = vpsrlw_avx512vl(auVar33,2);
        auVar33 = vmovdqa64_avx512vl(local_380._32_32_);
        auVar19 = vpand_avx2(auVar19,auVar13);
        auVar43 = vpandq_avx512vl(auVar43,auVar13);
        auVar43 = vpaddb_avx512vl(auVar43,auVar19);
        auVar19 = vpandq_avx512vl(auVar21,auVar14);
        auVar25 = vpandq_avx512vl(auVar22,auVar14);
        auVar25 = vpaddb_avx512vl(auVar25,auVar19);
        auVar19 = vpandq_avx512vl(auVar23,auVar14);
        auVar26 = vpandq_avx512vl(auVar20,auVar14);
        auVar26 = vpaddb_avx512vl(auVar26,auVar19);
        auVar19 = vpandq_avx512vl(auVar39,auVar14);
        auVar27 = vpandq_avx512vl(auVar40,auVar14);
        auVar27 = vpaddb_avx512vl(auVar27,auVar19);
        auVar19 = vpandq_avx512vl(auVar41,auVar14);
        auVar28 = vpandq_avx512vl(auVar42,auVar14);
        auVar28 = vpaddb_avx512vl(auVar28,auVar19);
        auVar19 = vpandq_avx512vl(auVar15,auVar14);
        auVar29 = vpandq_avx512vl(auVar16,auVar14);
        auVar29 = vpaddb_avx512vl(auVar29,auVar19);
        auVar19 = vpandq_avx512vl(auVar17,auVar14);
        auVar30 = vpandq_avx512vl(auVar24,auVar14);
        auVar30 = vpaddb_avx512vl(auVar30,auVar19);
        auVar19 = vpandq_avx512vl(auVar10,auVar14);
        auVar31 = vpandq_avx512vl(auVar11,auVar14);
        auVar31 = vpaddb_avx512vl(auVar31,auVar19);
        auVar19 = vpandq_avx512vl(auVar8,auVar14);
        auVar32 = vpandq_avx512vl(auVar43,auVar14);
        auVar32 = vpaddb_avx512vl(auVar32,auVar19);
        auVar19 = vpsrlw_avx512vl(auVar21,4);
        auVar21 = vpsrlw_avx512vl(auVar22,4);
        auVar19 = vpandq_avx512vl(auVar19,auVar14);
        auVar21 = vpandq_avx512vl(auVar21,auVar14);
        auVar21 = vpaddb_avx512vl(auVar21,auVar19);
        auVar22 = vmovdqa64_avx512vl(local_3c0._32_32_);
        auVar19 = vpsrlw_avx512vl(auVar23,4);
        auVar23 = vpsrlw_avx2(auVar20,4);
        auVar20 = vpandq_avx512vl(auVar19,auVar14);
        auVar19 = vpand_avx2(auVar23,auVar14);
        auVar23 = vpaddb_avx512vl(auVar19,auVar20);
        auVar34 = vmovdqa64_avx512vl(local_3c0._0_32_);
        auVar19 = vpsrlw_avx2(auVar39,4);
        auVar20 = vpsrlw_avx2(auVar40,4);
        auVar19 = vpand_avx2(auVar19,auVar14);
        auVar20 = vpand_avx2(auVar20,auVar14);
        auVar19 = vpaddb_avx2(auVar20,auVar19);
        auVar20 = vpsrlw_avx2(auVar41,4);
        auVar39 = vpsrlw_avx2(auVar42,4);
        auVar20 = vpand_avx2(auVar20,auVar14);
        auVar39 = vpand_avx2(auVar39,auVar14);
        auVar20 = vpaddb_avx2(auVar39,auVar20);
        auVar39 = vpsrlw_avx2(auVar15,4);
        auVar40 = vpsrlw_avx2(auVar16,4);
        auVar39 = vpand_avx2(auVar39,auVar14);
        auVar40 = vpand_avx2(auVar40,auVar14);
        auVar39 = vpaddb_avx2(auVar40,auVar39);
        auVar40 = vpsrlw_avx2(auVar17,4);
        auVar41 = vpsrlw_avx512vl(auVar24,4);
        auVar42 = vmovdqa64_avx512vl(local_400._32_32_);
        auVar40 = vpand_avx2(auVar40,auVar14);
        auVar41 = vpand_avx2(auVar41,auVar14);
        auVar40 = vpaddb_avx2(auVar41,auVar40);
        auVar10 = vpsrlw_avx2(auVar10,4);
        auVar11 = vpsrlw_avx2(auVar11,4);
        auVar10 = vpand_avx2(auVar10,auVar14);
        auVar11 = vpand_avx2(auVar11,auVar14);
        auVar10 = vpaddb_avx2(auVar11,auVar10);
        auVar11 = vpsrlw_avx2(auVar8,4);
        auVar8 = vpsrlw_avx2(auVar43,4);
        auVar11 = vpand_avx2(auVar11,auVar14);
        auVar8 = vpand_avx2(auVar8,auVar14);
        auVar11 = vpaddb_avx2(auVar8,auVar11);
        auVar8 = vpandq_avx512vl(auVar25,auVar9);
        auVar41 = vpandq_avx512vl(auVar26,auVar9);
        auVar8 = vpaddb_avx2(auVar41,auVar8);
        local_440._0_32_ = vpaddw_avx2(local_440._0_32_,auVar8);
        auVar8 = vpandq_avx512vl(auVar27,auVar9);
        auVar41 = vpandq_avx512vl(auVar28,auVar9);
        auVar8 = vpaddb_avx2(auVar41,auVar8);
        local_440._32_32_ = vpaddw_avx2(local_440._32_32_,auVar8);
        auVar8 = vpandq_avx512vl(auVar29,auVar9);
        auVar41 = vpandq_avx512vl(auVar30,auVar9);
        auVar8 = vpaddb_avx2(auVar41,auVar8);
        local_400._0_32_ = vpaddw_avx2(local_400._0_32_,auVar8);
        auVar8 = vpandq_avx512vl(auVar31,auVar9);
        auVar41 = vpandq_avx512vl(auVar32,auVar9);
        auVar8 = vpaddb_avx2(auVar41,auVar8);
        local_400._32_32_ = vpaddw_avx512vl(auVar42,auVar8);
        auVar41 = vpandq_avx512vl(auVar21,auVar9);
        auVar8 = vpand_avx2(auVar23,auVar9);
        auVar8 = vpaddb_avx2(auVar8,auVar41);
        local_3c0._0_32_ = vpaddw_avx512vl(auVar34,auVar8);
        auVar8 = vpand_avx2(auVar19,auVar9);
        auVar41 = vpand_avx2(auVar20,auVar9);
        auVar8 = vpaddb_avx2(auVar41,auVar8);
        local_3c0._32_32_ = vpaddw_avx512vl(auVar22,auVar8);
        auVar8 = vpand_avx2(auVar39,auVar9);
        auVar41 = vpand_avx2(auVar40,auVar9);
        auVar8 = vpaddb_avx2(auVar41,auVar8);
        local_380._0_32_ = vpaddw_avx512vl(auVar18,auVar8);
        auVar8 = vpand_avx2(auVar10,auVar9);
        auVar41 = vpand_avx2(auVar11,auVar9);
        auVar8 = vpaddb_avx2(auVar41,auVar8);
        local_380._32_32_ = vpaddw_avx512vl(auVar33,auVar8);
        auVar8 = vpsrlw_avx512vl(auVar25,8);
        auVar41 = vmovdqa64_avx512vl(local_340._0_32_);
        auVar42 = vpsrlw_avx512vl(auVar26,8);
        auVar15 = vmovdqa64_avx512vl(local_340._32_32_);
        auVar8 = vpaddb_avx2(auVar42,auVar8);
        local_340._0_32_ = vpaddw_avx512vl(auVar41,auVar8);
        auVar8 = vpsrlw_avx512vl(auVar27,8);
        auVar41 = vmovdqa64_avx512vl(local_300._0_32_);
        auVar42 = vpsrlw_avx512vl(auVar28,8);
        auVar8 = vpaddb_avx2(auVar42,auVar8);
        local_340._32_32_ = vpaddw_avx512vl(auVar15,auVar8);
        auVar8 = vpsrlw_avx512vl(auVar29,8);
        auVar42 = vpsrlw_avx512vl(auVar30,8);
        auVar8 = vpaddb_avx2(auVar42,auVar8);
        local_300._0_32_ = vpaddw_avx512vl(auVar41,auVar8);
        auVar8 = vpsrlw_avx512vl(auVar31,8);
        auVar41 = vpsrlw_avx512vl(auVar32,8);
        auVar8 = vpaddb_avx2(auVar41,auVar8);
        local_300._32_32_ = vpaddw_avx2(local_300._32_32_,auVar8);
        auVar8 = vpsrlw_avx512vl(auVar21,8);
        auVar41 = vpsrlw_avx2(auVar23,8);
        auVar8 = vpaddb_avx2(auVar8,auVar41);
        local_2c0._0_32_ = vpaddw_avx2(local_2c0._0_32_,auVar8);
        auVar8 = vpsrlw_avx2(auVar19,8);
        auVar19 = vpsrlw_avx2(auVar20,8);
        auVar8 = vpaddb_avx2(auVar19,auVar8);
        local_2c0._32_32_ = vpaddw_avx2(local_2c0._32_32_,auVar8);
        auVar8 = vpsrlw_avx2(auVar39,8);
        auVar19 = vpsrlw_avx2(auVar40,8);
        auVar8 = vpaddb_avx2(auVar19,auVar8);
        local_280._0_32_ = vpaddw_avx2(local_280._0_32_,auVar8);
        auVar10 = vpsrlw_avx2(auVar10,8);
        auVar11 = vpsrlw_avx2(auVar11,8);
        auVar10 = vpaddb_avx2(auVar11,auVar10);
        auVar10 = vpaddw_avx2(local_4a0,auVar10);
        local_4a0._0_8_ = auVar10._0_8_;
        local_4a0._8_8_ = auVar10._8_8_;
        local_4a0._16_8_ = auVar10._16_8_;
        local_4a0._24_8_ = auVar10._24_8_;
        lVar6 = lVar6 + 0x200;
        local_280._32_8_ = local_4a0._0_8_;
        local_280._40_8_ = local_4a0._8_8_;
        local_280._48_8_ = local_4a0._16_8_;
        local_280._56_8_ = local_4a0._24_8_;
      } while (lVar6 != 0x200000);
      local_400._32_32_ = vmovdqa64_avx512vl(local_400._32_32_);
      local_3c0._0_32_ = vmovdqa64_avx512vl(local_3c0._0_32_);
      local_3c0._32_32_ = vmovdqa64_avx512vl(local_3c0._32_32_);
      local_380._0_32_ = vmovdqa64_avx512vl(local_380._0_32_);
      local_380._32_32_ = vmovdqa64_avx512vl(local_380._32_32_);
      local_340._0_32_ = vmovdqa64_avx512vl(local_340._0_32_);
      local_340._32_32_ = vmovdqa64_avx512vl(local_340._32_32_);
      local_300._0_32_ = vmovdqa64_avx512vl(local_300._0_32_);
      lVar6 = 0;
      do {
        auVar38 = vpmovzxwd_avx512f(*(undefined1 (*) [32])(local_440 + lVar6 * 8));
        auVar38 = vpaddd_avx512f(ZEXT464(*(uint *)((long)flags + lVar6)),auVar38);
        auVar10 = vextracti64x4_avx512f(auVar38,1);
        auVar38 = vpaddd_avx512f(auVar38,ZEXT3264(auVar10));
        auVar1 = vpaddd_avx(auVar38._0_16_,auVar38._16_16_);
        auVar2 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddd_avx(auVar1,auVar2);
        auVar2 = vpshufd_avx(auVar1,0x55);
        auVar1 = vpaddd_avx(auVar1,auVar2);
        *(int *)((long)flags + lVar6) = auVar1._0_4_;
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x40);
      auVar38 = ZEXT1664((undefined1  [16])0x0);
      local_280 = vmovdqa64_avx512f(auVar38);
      local_2c0 = vmovdqa64_avx512f(auVar38);
      local_300 = vmovdqa64_avx512f(auVar38);
      local_340 = vmovdqa64_avx512f(auVar38);
      local_380 = vmovdqa64_avx512f(auVar38);
      local_3c0 = vmovdqa64_avx512f(auVar38);
      local_400 = vmovdqa64_avx512f(auVar38);
      local_440 = vmovdqa64_avx512f(auVar38);
      uVar5 = uVar5 + 1;
      puVar7 = puVar7 + 0x100000;
    } while (uVar5 != len >> 0x14);
    uVar5 = uVar5 * 0x1000;
  }
  lVar6 = uVar3 - uVar5;
  if (uVar5 <= uVar3 && lVar6 != 0) {
    local_480 = local_440._0_32_;
    auVar8 = vmovdqa64_avx512vl(local_440._32_32_);
    auVar9 = vmovdqa64_avx512vl(local_400._0_32_);
    auVar10 = vmovdqa64_avx512vl(local_400._32_32_);
    local_460 = local_3c0._0_32_;
    auVar11 = vmovdqa64_avx512vl(local_3c0._32_32_);
    pauVar4 = (undefined1 (*) [32])(array + uVar5 * 0x100 + 0xf0);
    auVar12 = vpbroadcastb_avx512vl(ZEXT116(0x55));
    auVar13 = vpbroadcastb_avx512vl(ZEXT116(0x33));
    auVar14 = vpbroadcastb_avx512vl(ZEXT116(7));
    do {
      auVar8 = vmovdqa64_avx512vl(auVar8);
      auVar9 = vmovdqa64_avx512vl(auVar9);
      auVar10 = vmovdqa64_avx512vl(auVar10);
      local_4a0._8_8_ = local_280._40_8_;
      local_4a0._0_8_ = local_280._32_8_;
      local_4a0._16_8_ = local_280._48_8_;
      local_4a0._24_8_ = local_280._56_8_;
      auVar15 = vmovdqu64_avx512vl(pauVar4[-3]);
      auVar16 = vmovdqu64_avx512vl(pauVar4[-2]);
      auVar17 = vmovdqu64_avx512vl(pauVar4[-1]);
      auVar18 = vmovdqu64_avx512vl(*pauVar4);
      auVar19 = vpandq_avx512vl(pauVar4[-0xf],auVar12);
      auVar20 = vpandq_avx512vl(pauVar4[-0xe],auVar12);
      auVar21 = vpaddb_avx512vl(auVar20,auVar19);
      auVar19 = vpandq_avx512vl(pauVar4[-0xd],auVar12);
      auVar20 = vpandq_avx512vl(pauVar4[-0xc],auVar12);
      auVar22 = vpaddb_avx512vl(auVar20,auVar19);
      auVar19 = vpandq_avx512vl(pauVar4[-0xb],auVar12);
      auVar20 = vpandq_avx512vl(pauVar4[-10],auVar12);
      auVar23 = vpaddb_avx512vl(auVar20,auVar19);
      auVar19 = vpandq_avx512vl(pauVar4[-9],auVar12);
      auVar20 = vpandq_avx512vl(pauVar4[-8],auVar12);
      auVar24 = vpaddb_avx512vl(auVar20,auVar19);
      auVar19 = vpandq_avx512vl(pauVar4[-7],auVar12);
      auVar20 = vpandq_avx512vl(pauVar4[-6],auVar12);
      auVar25 = vpaddb_avx512vl(auVar20,auVar19);
      auVar19 = vpandq_avx512vl(pauVar4[-5],auVar12);
      auVar20 = vpandq_avx512vl(pauVar4[-4],auVar12);
      auVar26 = vpaddb_avx512vl(auVar20,auVar19);
      auVar19 = vpandq_avx512vl(auVar15,auVar12);
      auVar20 = vpandq_avx512vl(auVar16,auVar12);
      auVar27 = vpaddb_avx512vl(auVar20,auVar19);
      auVar19 = vpandq_avx512vl(auVar17,auVar12);
      auVar20 = vpandq_avx512vl(auVar18,auVar12);
      auVar28 = vpaddb_avx512vl(auVar20,auVar19);
      auVar19 = vpsrlw_avx2(pauVar4[-0xf],1);
      auVar20 = vpsrlw_avx2(pauVar4[-0xe],1);
      auVar19 = vpandq_avx512vl(auVar19,auVar12);
      auVar20 = vpandq_avx512vl(auVar20,auVar12);
      auVar19 = vpaddb_avx2(auVar20,auVar19);
      auVar20 = vpsrlw_avx2(pauVar4[-0xd],1);
      auVar39 = vpsrlw_avx2(pauVar4[-0xc],1);
      auVar20 = vpandq_avx512vl(auVar20,auVar12);
      auVar39 = vpandq_avx512vl(auVar39,auVar12);
      auVar20 = vpaddb_avx2(auVar39,auVar20);
      auVar39 = vpsrlw_avx2(pauVar4[-0xb],1);
      auVar40 = vpsrlw_avx2(pauVar4[-10],1);
      auVar39 = vpandq_avx512vl(auVar39,auVar12);
      auVar40 = vpandq_avx512vl(auVar40,auVar12);
      auVar39 = vpaddb_avx2(auVar40,auVar39);
      auVar40 = vpsrlw_avx2(pauVar4[-9],1);
      auVar41 = vpsrlw_avx2(pauVar4[-8],1);
      auVar40 = vpandq_avx512vl(auVar40,auVar12);
      auVar41 = vpandq_avx512vl(auVar41,auVar12);
      auVar40 = vpaddb_avx2(auVar41,auVar40);
      auVar41 = vpsrlw_avx2(pauVar4[-7],1);
      auVar42 = vpsrlw_avx2(pauVar4[-6],1);
      auVar41 = vpandq_avx512vl(auVar41,auVar12);
      auVar42 = vpandq_avx512vl(auVar42,auVar12);
      auVar41 = vpaddb_avx2(auVar42,auVar41);
      auVar42 = vpsrlw_avx2(pauVar4[-5],1);
      auVar43 = vpsrlw_avx2(pauVar4[-4],1);
      auVar42 = vpandq_avx512vl(auVar42,auVar12);
      auVar43 = vpandq_avx512vl(auVar43,auVar12);
      auVar42 = vpaddb_avx2(auVar43,auVar42);
      auVar15 = vpsrlw_avx512vl(auVar15,1);
      auVar16 = vpsrlw_avx512vl(auVar16,1);
      auVar15 = vpandq_avx512vl(auVar15,auVar12);
      auVar16 = vpandq_avx512vl(auVar16,auVar12);
      auVar15 = vpaddb_avx2(auVar16,auVar15);
      auVar16 = vpsrlw_avx512vl(auVar17,1);
      auVar17 = vpsrlw_avx512vl(auVar18,1);
      auVar16 = vpandq_avx512vl(auVar16,auVar12);
      auVar17 = vpandq_avx512vl(auVar17,auVar12);
      auVar16 = vpaddb_avx2(auVar17,auVar16);
      auVar17 = vpandq_avx512vl(auVar21,auVar13);
      auVar18 = vpandq_avx512vl(auVar22,auVar13);
      auVar29 = vpaddb_avx512vl(auVar18,auVar17);
      auVar17 = vpandq_avx512vl(auVar23,auVar13);
      auVar18 = vpandq_avx512vl(auVar24,auVar13);
      auVar30 = vpaddb_avx512vl(auVar18,auVar17);
      auVar17 = vpandq_avx512vl(auVar25,auVar13);
      auVar18 = vpandq_avx512vl(auVar26,auVar13);
      auVar31 = vpaddb_avx512vl(auVar18,auVar17);
      auVar17 = vpandq_avx512vl(auVar27,auVar13);
      auVar18 = vpandq_avx512vl(auVar28,auVar13);
      auVar17 = vpaddb_avx2(auVar18,auVar17);
      auVar18 = vpandq_avx512vl(auVar19,auVar13);
      auVar43 = vpandq_avx512vl(auVar20,auVar13);
      auVar32 = vpaddb_avx512vl(auVar43,auVar18);
      auVar18 = vpandq_avx512vl(auVar39,auVar13);
      auVar43 = vpandq_avx512vl(auVar40,auVar13);
      auVar18 = vpaddb_avx2(auVar43,auVar18);
      auVar43 = vpandq_avx512vl(auVar41,auVar13);
      auVar33 = vpandq_avx512vl(auVar42,auVar13);
      auVar43 = vpaddb_avx2(auVar33,auVar43);
      auVar33 = vpandq_avx512vl(auVar15,auVar13);
      auVar34 = vpandq_avx512vl(auVar16,auVar13);
      auVar33 = vpaddb_avx2(auVar34,auVar33);
      auVar21 = vpsrlw_avx512vl(auVar21,2);
      auVar22 = vpsrlw_avx512vl(auVar22,2);
      auVar21 = vpandq_avx512vl(auVar21,auVar13);
      auVar22 = vpandq_avx512vl(auVar22,auVar13);
      auVar21 = vpaddb_avx2(auVar22,auVar21);
      auVar22 = vpsrlw_avx512vl(auVar23,2);
      auVar23 = vpsrlw_avx512vl(auVar24,2);
      auVar22 = vpandq_avx512vl(auVar22,auVar13);
      auVar23 = vpandq_avx512vl(auVar23,auVar13);
      auVar22 = vpaddb_avx2(auVar23,auVar22);
      auVar23 = vpsrlw_avx512vl(auVar25,2);
      auVar24 = vpsrlw_avx512vl(auVar26,2);
      auVar23 = vpandq_avx512vl(auVar23,auVar13);
      auVar24 = vpandq_avx512vl(auVar24,auVar13);
      auVar23 = vpaddb_avx2(auVar24,auVar23);
      auVar24 = vpsrlw_avx512vl(auVar27,2);
      auVar25 = vpsrlw_avx512vl(auVar28,2);
      auVar24 = vpandq_avx512vl(auVar24,auVar13);
      auVar25 = vpandq_avx512vl(auVar25,auVar13);
      auVar24 = vpaddb_avx512vl(auVar25,auVar24);
      auVar19 = vpsrlw_avx2(auVar19,2);
      auVar20 = vpsrlw_avx2(auVar20,2);
      auVar19 = vpandq_avx512vl(auVar19,auVar13);
      auVar20 = vpandq_avx512vl(auVar20,auVar13);
      auVar19 = vpaddb_avx2(auVar20,auVar19);
      auVar20 = vpsrlw_avx2(auVar39,2);
      auVar39 = vpsrlw_avx2(auVar40,2);
      auVar20 = vpandq_avx512vl(auVar20,auVar13);
      auVar39 = vpandq_avx512vl(auVar39,auVar13);
      auVar20 = vpaddb_avx2(auVar39,auVar20);
      auVar39 = vpsrlw_avx2(auVar41,2);
      auVar40 = vpsrlw_avx2(auVar42,2);
      auVar39 = vpandq_avx512vl(auVar39,auVar13);
      auVar40 = vpandq_avx512vl(auVar40,auVar13);
      auVar39 = vpaddb_avx2(auVar40,auVar39);
      auVar40 = vpsrlw_avx2(auVar15,2);
      auVar41 = vpsrlw_avx2(auVar16,2);
      auVar40 = vpandq_avx512vl(auVar40,auVar13);
      auVar41 = vpandq_avx512vl(auVar41,auVar13);
      auVar40 = vpaddb_avx2(auVar41,auVar40);
      auVar41 = vpandq_avx512vl(auVar29,auVar14);
      auVar42 = vpandq_avx512vl(auVar30,auVar14);
      auVar41 = vpaddb_avx2(auVar42,auVar41);
      auVar42 = vpandq_avx512vl(auVar31,auVar14);
      auVar15 = vpandq_avx512vl(auVar17,auVar14);
      auVar42 = vpaddb_avx2(auVar15,auVar42);
      auVar15 = vpandq_avx512vl(auVar32,auVar14);
      auVar16 = vpandq_avx512vl(auVar18,auVar14);
      auVar15 = vpaddb_avx2(auVar16,auVar15);
      auVar16 = vpandq_avx512vl(auVar43,auVar14);
      auVar25 = vpandq_avx512vl(auVar33,auVar14);
      auVar16 = vpaddb_avx2(auVar25,auVar16);
      auVar25 = vpandq_avx512vl(auVar21,auVar14);
      auVar26 = vpandq_avx512vl(auVar22,auVar14);
      auVar25 = vpaddb_avx512vl(auVar26,auVar25);
      auVar26 = vpandq_avx512vl(auVar23,auVar14);
      auVar27 = vpandq_avx512vl(auVar24,auVar14);
      auVar26 = vpaddb_avx512vl(auVar27,auVar26);
      auVar27 = vpandq_avx512vl(auVar19,auVar14);
      auVar28 = vpandq_avx512vl(auVar20,auVar14);
      auVar27 = vpaddb_avx512vl(auVar28,auVar27);
      auVar28 = vpandq_avx512vl(auVar39,auVar14);
      auVar34 = vpandq_avx512vl(auVar40,auVar14);
      auVar28 = vpaddb_avx512vl(auVar34,auVar28);
      auVar29 = vpsrlw_avx512vl(auVar29,4);
      auVar30 = vpsrlw_avx512vl(auVar30,4);
      auVar34 = vmovdqa64_avx512vl(auVar9);
      auVar9 = vpandq_avx512vl(auVar29,auVar14);
      auVar29 = vpandq_avx512vl(auVar30,auVar14);
      auVar29 = vpaddb_avx512vl(auVar29,auVar9);
      auVar9 = vpsrlw_avx512vl(auVar31,4);
      auVar30 = vmovdqa64_avx512vl(auVar10);
      auVar10 = vpsrlw_avx2(auVar17,4);
      auVar9 = vpandq_avx512vl(auVar9,auVar14);
      auVar10 = vpandq_avx512vl(auVar10,auVar14);
      auVar31 = vpaddb_avx512vl(auVar10,auVar9);
      auVar9 = vpsrlw_avx512vl(auVar32,4);
      auVar8 = vmovdqa64_avx512vl(auVar8);
      auVar10 = vpsrlw_avx2(auVar18,4);
      auVar9 = vpandq_avx512vl(auVar9,auVar14);
      auVar10 = vpandq_avx512vl(auVar10,auVar14);
      auVar18 = vpaddb_avx512vl(auVar10,auVar9);
      auVar9 = vpsrlw_avx2(auVar43,4);
      auVar10 = vpsrlw_avx2(auVar33,4);
      auVar9 = vpandq_avx512vl(auVar9,auVar14);
      auVar10 = vpandq_avx512vl(auVar10,auVar14);
      auVar43 = vpaddb_avx512vl(auVar10,auVar9);
      auVar9 = vpsrlw_avx2(auVar21,4);
      auVar10 = vpsrlw_avx2(auVar22,4);
      auVar9 = vpandq_avx512vl(auVar9,auVar14);
      auVar10 = vpandq_avx512vl(auVar10,auVar14);
      auVar33 = vpaddb_avx512vl(auVar10,auVar9);
      auVar9 = vpsrlw_avx2(auVar23,4);
      auVar10 = vpsrlw_avx2(auVar24,4);
      auVar9 = vpandq_avx512vl(auVar9,auVar14);
      auVar10 = vpandq_avx512vl(auVar10,auVar14);
      auVar17 = vpaddb_avx2(auVar10,auVar9);
      auVar9 = vpsrlw_avx2(auVar19,4);
      auVar10 = vpsrlw_avx2(auVar20,4);
      auVar9 = vpandq_avx512vl(auVar9,auVar14);
      auVar10 = vpandq_avx512vl(auVar10,auVar14);
      auVar19 = vpaddb_avx2(auVar10,auVar9);
      auVar9 = vpsrlw_avx2(auVar39,4);
      auVar10 = vpsrlw_avx2(auVar40,4);
      auVar9 = vpandq_avx512vl(auVar9,auVar14);
      auVar10 = vpandq_avx512vl(auVar10,auVar14);
      auVar20 = vpaddb_avx2(auVar10,auVar9);
      auVar21._8_2_ = 0xf;
      auVar21._0_8_ = 0xf000f000f000f;
      auVar21._10_2_ = 0xf;
      auVar21._12_2_ = 0xf;
      auVar21._14_2_ = 0xf;
      auVar21._16_2_ = 0xf;
      auVar21._18_2_ = 0xf;
      auVar21._20_2_ = 0xf;
      auVar21._22_2_ = 0xf;
      auVar21._24_2_ = 0xf;
      auVar21._26_2_ = 0xf;
      auVar21._28_2_ = 0xf;
      auVar21._30_2_ = 0xf;
      auVar9 = vpand_avx2(auVar41,auVar21);
      auVar10 = vpand_avx2(auVar42,auVar21);
      auVar9 = vpaddb_avx2(auVar10,auVar9);
      local_480 = vpaddw_avx2(local_480,auVar9);
      auVar9 = vpand_avx2(auVar15,auVar21);
      auVar10 = vpand_avx2(auVar16,auVar21);
      auVar9 = vpaddb_avx2(auVar10,auVar9);
      auVar8 = vpaddw_avx512vl(auVar8,auVar9);
      auVar9 = vpandq_avx512vl(auVar25,auVar21);
      auVar10 = vpandq_avx512vl(auVar26,auVar21);
      auVar9 = vpaddb_avx2(auVar10,auVar9);
      auVar9 = vpaddw_avx512vl(auVar34,auVar9);
      auVar10 = vpandq_avx512vl(auVar27,auVar21);
      auVar39 = vpandq_avx512vl(auVar28,auVar21);
      auVar10 = vpaddb_avx2(auVar39,auVar10);
      auVar10 = vpaddw_avx512vl(auVar30,auVar10);
      auVar39 = vpandq_avx512vl(auVar29,auVar21);
      auVar40 = vpandq_avx512vl(auVar31,auVar21);
      auVar39 = vpaddb_avx2(auVar40,auVar39);
      local_460 = vpaddw_avx2(local_460,auVar39);
      auVar39 = vpandq_avx512vl(auVar18,auVar21);
      auVar40 = vpandq_avx512vl(auVar43,auVar21);
      auVar39 = vpaddb_avx2(auVar40,auVar39);
      auVar11 = vpaddw_avx512vl(auVar11,auVar39);
      auVar40 = vpandq_avx512vl(auVar33,auVar21);
      auVar39 = vpand_avx2(auVar17,auVar21);
      auVar39 = vpaddb_avx2(auVar39,auVar40);
      local_380._0_32_ = vpaddw_avx2(local_380._0_32_,auVar39);
      auVar39 = vpand_avx2(auVar19,auVar21);
      auVar40 = vpand_avx2(auVar20,auVar21);
      auVar39 = vpaddb_avx2(auVar40,auVar39);
      local_380._32_32_ = vpaddw_avx2(local_380._32_32_,auVar39);
      auVar39 = vpsrlw_avx2(auVar41,8);
      auVar40 = vpsrlw_avx2(auVar42,8);
      auVar39 = vpaddb_avx2(auVar40,auVar39);
      local_340._0_32_ = vpaddw_avx2(local_340._0_32_,auVar39);
      auVar39 = vpsrlw_avx2(auVar15,8);
      auVar40 = vpsrlw_avx2(auVar16,8);
      auVar39 = vpaddb_avx2(auVar40,auVar39);
      local_340._32_32_ = vpaddw_avx2(local_340._32_32_,auVar39);
      auVar39 = vpsrlw_avx512vl(auVar25,8);
      auVar40 = vpsrlw_avx512vl(auVar26,8);
      auVar39 = vpaddb_avx2(auVar40,auVar39);
      local_300._0_32_ = vpaddw_avx2(local_300._0_32_,auVar39);
      auVar39 = vpsrlw_avx512vl(auVar27,8);
      auVar40 = vpsrlw_avx512vl(auVar28,8);
      auVar39 = vpaddb_avx2(auVar40,auVar39);
      local_300._32_32_ = vpaddw_avx2(local_300._32_32_,auVar39);
      auVar39 = vpsrlw_avx512vl(auVar29,8);
      auVar40 = vpsrlw_avx512vl(auVar31,8);
      auVar39 = vpaddb_avx2(auVar40,auVar39);
      local_2c0._0_32_ = vpaddw_avx2(local_2c0._0_32_,auVar39);
      auVar39 = vpsrlw_avx512vl(auVar18,8);
      auVar40 = vpsrlw_avx512vl(auVar43,8);
      auVar39 = vpaddb_avx2(auVar40,auVar39);
      local_2c0._32_32_ = vpaddw_avx2(local_2c0._32_32_,auVar39);
      auVar39 = vpsrlw_avx512vl(auVar33,8);
      auVar40 = vpsrlw_avx2(auVar17,8);
      auVar39 = vpaddb_avx2(auVar40,auVar39);
      local_280._0_32_ = vpaddw_avx2(local_280._0_32_,auVar39);
      auVar19 = vpsrlw_avx2(auVar19,8);
      auVar20 = vpsrlw_avx2(auVar20,8);
      auVar19 = vpaddb_avx2(auVar20,auVar19);
      auVar19 = vpaddw_avx2(local_4a0,auVar19);
      local_4a0._0_8_ = auVar19._0_8_;
      local_4a0._8_8_ = auVar19._8_8_;
      local_4a0._16_8_ = auVar19._16_8_;
      local_4a0._24_8_ = auVar19._24_8_;
      pauVar4 = pauVar4 + 0x10;
      lVar6 = lVar6 + -1;
      local_280._32_8_ = local_4a0._0_8_;
      local_280._40_8_ = local_4a0._8_8_;
      local_280._48_8_ = local_4a0._16_8_;
      local_280._56_8_ = local_4a0._24_8_;
    } while (lVar6 != 0);
    local_440._32_32_ = vmovdqa64_avx512vl(auVar8);
    local_440._0_32_ = local_480;
    local_400._0_32_ = vmovdqa64_avx512vl(auVar9);
    local_400._32_32_ = vmovdqa64_avx512vl(auVar10);
    local_3c0._32_32_ = vmovdqa64_avx512vl(auVar11);
    local_3c0._0_32_ = local_460;
    uVar5 = uVar3;
  }
  uVar5 = uVar5 << 8;
  if (uVar5 < len) {
    auVar38 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar35 = vpmovsxbd_avx512f(_DAT_0010f080);
    auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar37 = vpbroadcastd_avx512f();
      auVar37 = vpsrlvd_avx512f(auVar37,auVar35);
      auVar37 = vpandd_avx512f(auVar37,auVar36);
      auVar38 = vpaddd_avx512f(auVar37,auVar38);
      uVar5 = uVar5 + 1;
    } while (len != uVar5);
    auVar38 = vmovdqu64_avx512f(auVar38);
    *(undefined1 (*) [64])flags = auVar38;
  }
  lVar6 = 0;
  do {
    auVar38 = vpmovzxwd_avx512f(*(undefined1 (*) [32])(local_440 + lVar6 * 8));
    auVar38 = vpaddd_avx512f(ZEXT464(*(uint *)((long)flags + lVar6)),auVar38);
    auVar12 = vextracti64x4_avx512f(auVar38,1);
    auVar38 = vpaddd_avx512f(auVar38,ZEXT3264(auVar12));
    auVar1 = vpaddd_avx(auVar38._0_16_,auVar38._16_16_);
    auVar2 = vpshufd_avx(auVar1,0xee);
    auVar1 = vpaddd_avx(auVar1,auVar2);
    auVar2 = vpshufd_avx(auVar1,0x55);
    auVar1 = vpaddd_avx(auVar1,auVar2);
    *(int *)((long)flags + lVar6) = auVar1._0_4_;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x40);
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_adder_forest(const uint16_t* array, uint32_t len, uint32_t* flags) {
    __m256i counters[16];

    for (size_t i = 0; i < 16; ++i) {
        counters[i] = _mm256_setzero_si256();
    }

    const __m256i mask1bit = _mm256_set1_epi16(0x5555); // 0101010101010101
    const __m256i mask2bit = _mm256_set1_epi16(0x3333); // 0011001100110011
    const __m256i mask4bit = _mm256_set1_epi16(0x0F0F); // 1111000011110000
    const __m256i mask8bit = _mm256_set1_epi16(0x00FF); // 0000000011111111
    
    const uint32_t n_cycles = len / (4096 * (16*16));
    const uint32_t n_total  = len / (16*16);
    uint16_t tmp[16];

/*------ Macros --------*/
#define LL(i,p,k)  const __m256i sum##p##k##_##i##bit_even = _mm256_add_epi8(input##p & mask##i##bit, input##k & mask##i##bit);
#define LO(i,p,k)  const __m256i sum##p##k##_##i##bit_odd  = _mm256_add_epi8(_mm256_srli_epi16(input##p, i) & mask##i##bit, _mm256_srli_epi16(input##k, i) & mask##i##bit);

#define LBLOCK(i)                                 \
    LL(i,0,1) LL(i,2,3)   LL(i,4,5)   LL(i,6,7)   \
    LL(i,8,9) LL(i,10,11) LL(i,12,13) LL(i,14,15) \
    LO(i,0,1) LO(i,2,3)   LO(i,4,5)   LO(i,6,7)   \
    LO(i,8,9) LO(i,10,11) LO(i,12,13) LO(i,14,15)

#define EVEN(b,i,k,p) input##i = sum##k##p##_##b##bit_even;
#define ODD(b,i,k,p)  input##i = sum##k##p##_##b##bit_odd;

#define UPDATE(i)                                                  \
    EVEN(i,0,0,1) EVEN(i,1,2,3)   EVEN(i,2,4,5)   EVEN(i,3,6,7)    \
    EVEN(i,4,8,9) EVEN(i,5,10,11) EVEN(i,6,12,13) EVEN(i,7,14,15)  \
     ODD(i,8,0,1)  ODD(i,9,2,3)    ODD(i,10,4,5)   ODD(i,11,6,7)   \
     ODD(i,12,8,9) ODD(i,13,10,11) ODD(i,14,12,13) ODD(i,15,14,15) \

#define UE(i,p,k) counters[i] = _mm256_add_epi16(counters[i], sum##p##k##_8bit_even);
#define UO(i,p,k) counters[i] = _mm256_add_epi16(counters[i], sum##p##k##_8bit_odd);

/*------ Start --------*/
#define L(p) __m256i input##p = _mm256_loadu_si256((__m256i*)(array + i*4096*256 + j*256 + p*16));
    size_t i = 0;
    for (/**/; i < n_cycles; ++i) {
        for (int j = 0; j < 4096; ++j) {
            // Load 16 registers.
            L(0)  L(1)  L(2)  L(3)  
            L(4)  L(5)  L(6)  L(7) 
            L(8)  L(9)  L(10) L(11) 
            L(12) L(13) L(14) L(15)

            // Perform updates for bits {1,2,4,8}.
            LBLOCK(1) UPDATE(1)
            LBLOCK(2) UPDATE(2)
            LBLOCK(4) UPDATE(4)
            LBLOCK(8) UPDATE(8)

            // Update accumulators.
            UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
            UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
            UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
            UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
        }

        // Update.
        for (size_t i = 0; i < 16; ++i) {
            _mm256_storeu_si256((__m256i*)tmp, counters[i]);
            for (int j = 0; j < 16; ++j)
                flags[i] += tmp[j];
        }
        // Reset.
        for (size_t i = 0; i < 16; ++i) {
            counters[i] = _mm256_setzero_si256();
        }
    }
#undef L
#define L(p) __m256i input##p = _mm256_loadu_si256((__m256i*)(array + i*256 + p*16));
    i *= 4096;
    for (/**/; i < n_total; ++i) {
        // Load 16 registers.
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

        // Perform updates for bits {1,2,4,8}.
        LBLOCK(1) UPDATE(1)
        LBLOCK(2) UPDATE(2)
        LBLOCK(4) UPDATE(4)
        LBLOCK(8) UPDATE(8)

        // Update accumulators.
        UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
        UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
        UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
        UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
    }

    i *= 256;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef UPDATE
#undef ODD
#undef EVEN
#undef LBLOCK
#undef LL
#undef LO
#undef UO
#undef UE

    for (size_t i = 0; i < 16; ++i) {
        _mm256_storeu_si256((__m256i*)tmp, counters[i]);
        for (int j = 0; j < 16; ++j)
            flags[i] += tmp[j];
    }
    return 0;
}